

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O2

void __thiscall
CryptoUtil_DecryptAes256ToStringKeyEmpty_Test::~CryptoUtil_DecryptAes256ToStringKeyEmpty_Test
          (CryptoUtil_DecryptAes256ToStringKeyEmpty_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, DecryptAes256ToStringKeyEmpty) {
  try {
    std::vector<uint8_t> key;
    ByteData data(
        "752fe203af4a4d427997e5d2c8b246530e0546b66d2982a49e333e77295dccea");
    std::string result = CryptoUtil::DecryptAes256ToString(key, data);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "DecryptAes256 key size error.");
    return;
  }
  ASSERT_TRUE(false);
}